

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_oarchive.h
# Opt level: O2

void __thiscall serialization::xml_oarchive::save(xml_oarchive *this,int v)

{
  xml_node<char> *pxVar1;
  char *pcVar2;
  char *pcVar3;
  char buffer [64];
  char acStack_68 [72];
  
  pcVar2 = rapidjson::internal::i64toa((long)v,acStack_68);
  pxVar1 = this->current_;
  pcVar3 = rapidxml::memory_pool<char>::allocate_string
                     (&(this->document_).super_memory_pool<char>,acStack_68,
                      (long)pcVar2 - (long)acStack_68);
  (pxVar1->super_xml_base<char>).m_value = pcVar3;
  (pxVar1->super_xml_base<char>).m_value_size = (long)pcVar2 - (long)acStack_68;
  return;
}

Assistant:

void save(int v)
	{
		char buffer[64];
		const char* end = rapidjson::internal::i64toa(v, buffer);
        current_->value(document_.allocate_string(buffer, end - buffer), end - buffer);
	}